

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user.c
# Opt level: O2

int linux_evfilt_user_knote_modify(filter *filt,knote *kn,kevent *kev)

{
  int iVar1;
  
  iVar1 = (*(code *)(&DAT_00107450 + *(int *)(&DAT_00107450 + (ulong)(kev->fflags >> 0x1e ^ 2) * 4))
          )();
  return iVar1;
}

Assistant:

int
linux_evfilt_user_knote_modify(struct filter *filt UNUSED, struct knote *kn, const struct kevent *kev)
{
    unsigned int ffctrl;
    unsigned int fflags;

    /* Excerpted from sys/kern/kern_event.c in FreeBSD HEAD */
    ffctrl = kev->fflags & NOTE_FFCTRLMASK;
    fflags = kev->fflags & NOTE_FFLAGSMASK;
    switch (ffctrl) {
        case NOTE_FFNOP:
            break;

        case NOTE_FFAND:
            kn->kev.fflags &= fflags;
            break;

        case NOTE_FFOR:
            kn->kev.fflags |= fflags;
            break;

        case NOTE_FFCOPY:
            kn->kev.fflags = fflags;
            break;

        default:
            /* XXX Return error? */
            break;
    }

    if ((!(kn->kev.flags & EV_DISABLE)) && kev->fflags & NOTE_TRIGGER) {
        kn->kev.fflags |= NOTE_TRIGGER;
        if (eventfd_raise(kn->kn_eventfd) < 0)
            return (-1);
    }

    return (0);
}